

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O1

void __thiscall
iqnet::Reactor<iqnet::Null_lock>::handle_user_events(Reactor<iqnet::Null_lock> *this)

{
  ushort *puVar1;
  _List_node_base *p_Var2;
  undefined1 *puVar3;
  _List_node_base *p_Var4;
  HandlerStateList called_by_user;
  HandlerState hs;
  undefined1 *local_48;
  undefined1 *local_40;
  long local_38;
  HandlerState local_30;
  
  local_40 = (undefined1 *)&local_48;
  local_48 = (undefined1 *)&local_48;
  local_38 = 0;
  for (p_Var2 = (this->handlers_states).
                super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->handlers_states; p_Var2 = p_Var2->_M_next) {
    if (*(short *)((long)&p_Var2[1]._M_next + 6) != 0) {
      p_Var4 = (_List_node_base *)operator_new(0x18);
      p_Var4[1]._M_next = p_Var2[1]._M_next;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      local_38 = local_38 + 1;
      puVar1 = (ushort *)((long)&p_Var2[1]._M_next + 6);
      *puVar1 = *puVar1 & (ushort)(*(short *)((long)&p_Var2[1]._M_next + 4) == 0);
    }
  }
  if ((undefined1 **)local_48 != &local_48) {
    do {
      puVar3 = local_48;
      local_30 = *(HandlerState *)(local_48 + 0x10);
      local_38 = local_38 + -1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(puVar3,0x18);
      invoke_event_handler(this,&local_30);
    } while ((undefined1 **)local_48 != &local_48);
  }
  return;
}

Assistant:

void Reactor<Lock>::handle_user_events()
{
  HandlerStateList called_by_user;
  scoped_lock lk(lock);

  for( hs_iterator i = begin(); i != end(); ++i )
  {
    if( i->revents && (i->mask | i->revents) )
    {
      called_by_user.push_back( *i );
      i->revents &= !i->mask;
    }
  }

  lk.unlock();

  while( !called_by_user.empty() )
  {
    HandlerState hs(called_by_user.front());
    called_by_user.pop_front();
    invoke_event_handler(hs);
  }
}